

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O0

bool Assimp::IFC::IsTrue(BOOLEAN *in)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  PrimitiveDataType *local_18;
  BOOLEAN *in_local;
  
  local_18 = (PrimitiveDataType *)in;
  pbVar2 = STEP::EXPRESS::PrimitiveDataType::operator_cast_to_string_((PrimitiveDataType *)in);
  std::__cxx11::string::string((string *)&local_38,(string *)pbVar2);
  bVar1 = std::operator==(&local_38,"TRUE");
  local_79 = true;
  if (!bVar1) {
    pbVar2 = STEP::EXPRESS::PrimitiveDataType::operator_cast_to_string_(local_18);
    std::__cxx11::string::string((string *)&local_68,(string *)pbVar2);
    local_79 = std::operator==(&local_68,"T");
  }
  in_local._7_1_ = local_79;
  if (!bVar1) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return (bool)(in_local._7_1_ & 1);
}

Assistant:

bool IsTrue(const ::Assimp::STEP::EXPRESS::BOOLEAN& in)
{
    return (std::string)in == "TRUE" || (std::string)in == "T";
}